

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O1

Offset<MyGame::Example::Monster>
MyGame::Example::CreateMonster(FlatBufferBuilder *_fbb,MonsterT *_o,rehasher_function_t *_rehasher)

{
  Color color;
  Any AVar1;
  bool bVar2;
  AnyUniqueAliases AVar3;
  uchar uVar4;
  AnyAmbiguousAliases AVar5;
  Race signed_enum;
  unsigned_short e;
  uint uVar6;
  uchar *puVar7;
  Test *pTVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  StatT *pSVar11;
  Ability *v;
  double *v_00;
  Color *v_01;
  undefined4 *puVar12;
  long *plVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  _Any_data *p_Var18;
  Offset<MyGame::Example::Monster> OVar19;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> OVar20;
  Offset<MyGame::Example::Monster> OVar21;
  uoffset_t uVar22;
  Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> OVar23;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> vector_of_enums;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> testrequirednestedflatbuffer;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int>_>
  scalar_key_sorted_tables;
  offset_type extraout_EAX;
  offset_type oVar24;
  unsigned_long uVar25;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 uVar26;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 *puVar27;
  MonsterT *pMVar28;
  MonsterT *this;
  string *psVar29;
  void *pvVar30;
  size_t sVar32;
  long lVar33;
  ulong uVar34;
  long *plVar35;
  _Any_data *p_Var36;
  long *plVar37;
  Offset<flatbuffers::String> off;
  ulong e_00;
  _VectorArgs _va;
  MonsterT *pMStackY_3b8;
  _Any_data *p_StackY_3b0;
  _Any_data *p_StackY_3a8;
  vector<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>,std::allocator<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>>>
  *pvStackY_3a0;
  vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
  *pvStackY_398;
  vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
  *pvStackY_390;
  vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
  *pvStackY_388;
  _Any_data *p_StackY_380;
  _Any_data *p_StackY_378;
  StringOffsetMap **ppSStackY_370;
  bool *pbStackY_368;
  _Any_data *p_StackY_360;
  _Any_data *p_StackY_358;
  _Any_data *p_StackY_350;
  _Any_data *p_StackY_348;
  size_t *psStackY_340;
  _Any_data *p_StackY_338;
  _Any_data *p_StackY_330;
  size_t *psStackY_328;
  _Any_data *p_StackY_320;
  StringOffsetMap **ppSStackY_318;
  bool *pbStackY_310;
  uint8_t **ppuStackY_308;
  _Any_data *p_StackY_300;
  FlatBufferBuilder *pFStackY_2f8;
  MonsterT *pMStackY_2f0;
  ulong uStackY_2e8;
  _Any_data *p_StackY_2e0;
  undefined8 uStackY_2d8;
  ulong uStackY_2d0;
  ReferrableT *local_138;
  int16_t local_12c;
  int16_t local_12a;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
  local_128;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_124;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
  local_120;
  Offset<flatbuffers::Vector<double,_unsigned_int>_> local_11c;
  Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> local_118;
  Offset<flatbuffers::Vector<const_MyGame::Example::Ability_*,_unsigned_int>_> local_114;
  _Any_data *local_110;
  Offset<void> local_108;
  Offset<void> local_104;
  uint local_100;
  Offset<MyGame::Example::Stat> local_fc;
  Offset<MyGame::InParentNamespace> local_f8;
  Offset<flatbuffers::Vector<long,_unsigned_int>_> local_f4;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_f0;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> local_ec;
  float local_e8;
  float local_e4;
  float local_e0;
  int32_t local_dc;
  uint32_t local_d8;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_d4;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_> local_d0
  ;
  Offset<MyGame::Example::Monster> local_cc;
  Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> local_c8;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> local_c4;
  Offset<void> local_c0;
  uint local_bc;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_b8;
  Offset<flatbuffers::String> local_b4;
  FlatBufferBuilder *local_b0;
  MonsterT *local_a8;
  rehasher_function_t *local_a0;
  unsigned_long local_98;
  unsigned_long local_90;
  unsigned_long local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  uint64_t local_60;
  int64_t local_58;
  unsigned_long local_50;
  uint64_t local_48;
  int64_t local_40;
  Vec3 *local_38;
  reference pvVar31;
  
  local_38 = (_o->pos)._M_t.
             super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>
             ._M_t.
             super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>
             .super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl;
  local_12a = _o->mana;
  local_12c = _o->hp;
  uStackY_2d0 = 0x175013;
  p_Var36 = (_Any_data *)_fbb;
  local_b0 = _fbb;
  local_a8 = _o;
  local_a0 = _rehasher;
  flatbuffers::FlatBufferBuilderImpl<false>::CreateStringImpl
            (_fbb,(_o->name)._M_dataplus._M_p,(_o->name)._M_string_length);
  local_b4.o = (_fbb->buf_).size_;
  puVar7 = (_o->inventory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  OVar19.o = 0;
  local_b8.o = 0;
  sVar32 = (long)(_o->inventory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar7;
  if (sVar32 != 0) {
    uStackY_2d0 = 0x17503b;
    p_Var36 = (_Any_data *)_fbb;
    local_b8 = flatbuffers::FlatBufferBuilderImpl<false>::
               CreateVector<unsigned_char,_flatbuffers::Offset,_flatbuffers::Vector>
                         (_fbb,puVar7,sVar32);
  }
  color = _o->color;
  AVar1 = (_o->test).type;
  local_bc = (uint)AVar1;
  if (local_bc == 3) {
    uStackY_2d0 = 0x1750b9;
    flatbuffers::FlatBufferBuilderImpl<false>::NotNested(_fbb);
    _fbb->nested = true;
    uVar22 = (_fbb->buf_).size_;
LAB_001750c3:
    uStackY_2d0 = 0x1750c8;
    p_Var36 = (_Any_data *)_fbb;
    OVar19.o = flatbuffers::FlatBufferBuilderImpl<false>::EndTable(_fbb,uVar22);
  }
  else {
    if (AVar1 == Any_TestSimpleTableWithEnum) {
      uVar4 = *(_o->test).value;
      uStackY_2d0 = 0x17508c;
      flatbuffers::FlatBufferBuilderImpl<false>::NotNested(_fbb);
      _fbb->nested = true;
      uVar22 = (_fbb->buf_).size_;
      uStackY_2d0 = 0x1750a9;
      flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_char>(_fbb,4,uVar4,'\x02');
      goto LAB_001750c3;
    }
    if (AVar1 == Any_Monster) {
      uStackY_2d0 = 0x175079;
      p_Var36 = (_Any_data *)_fbb;
      OVar19 = CreateMonster(_fbb,(MonsterT *)(_o->test).value,(rehasher_function_t *)0x0);
    }
  }
  pTVar8 = (_o->test4).
           super__Vector_base<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>._M_impl
           .super__Vector_impl_data._M_start;
  OVar20.o = 0;
  local_c8.o = 0;
  lVar33 = (long)(_o->test4).
                 super__Vector_base<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pTVar8;
  if (lVar33 != 0) {
    uStackY_2d0 = 0x1750ed;
    p_Var36 = (_Any_data *)_fbb;
    local_c8 = flatbuffers::FlatBufferBuilderImpl<false>::
               CreateVectorOfStructs<MyGame::Example::Test,_flatbuffers::Offset,_flatbuffers::Vector>
                         (_fbb,pTVar8,lVar33 >> 2);
  }
  _Var9._M_current =
       (_o->testarrayofstring).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var10._M_current =
       (_o->testarrayofstring).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var10._M_current != _Var9._M_current) {
    uStackY_2d0 = 0x17510e;
    p_Var36 = (_Any_data *)_fbb;
    OVar20 = flatbuffers::FlatBufferBuilderImpl<false>::
             CreateVectorOfStrings<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       (_fbb,_Var9,_Var10);
  }
  e_00 = 0;
  local_d0.o = 0;
  lVar33 = (long)(_o->testarrayoftables).
                 super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(_o->testarrayoftables).
                 super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar33 != 0) {
    uStackY_2d0 = 0x17513f;
    p_Var36 = (_Any_data *)_fbb;
    local_d0 = flatbuffers::FlatBufferBuilderImpl<false>::
               CreateVector<flatbuffers::Offset<MyGame::Example::Monster>,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_1_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                         (_fbb,lVar33 >> 3,&local_b0);
  }
  pMVar28 = (_o->enemy)._M_t.
            super___uniq_ptr_impl<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>
            ._M_t.
            super__Tuple_impl<0UL,_MyGame::Example::MonsterT_*,_std::default_delete<MyGame::Example::MonsterT>_>
            .super__Head_base<0UL,_MyGame::Example::MonsterT_*,_false>._M_head_impl;
  if (pMVar28 != (MonsterT *)0x0) {
    uStackY_2d0 = 0x17515e;
    p_Var36 = (_Any_data *)_fbb;
    OVar21 = CreateMonster(_fbb,pMVar28,_rehasher);
    e_00 = (ulong)OVar21.o;
  }
  local_cc.o = (offset_type)e_00;
  plVar35 = (long *)(_o->testnestedflatbuffer).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  uVar34 = 0;
  local_d4.o = 0;
  sVar32 = (long)(_o->testnestedflatbuffer).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)plVar35;
  local_110 = (_Any_data *)_rehasher;
  local_c4.o = OVar20.o;
  local_c0.o = OVar19.o;
  if (sVar32 != 0) {
    uStackY_2d0 = 0x1751a4;
    p_Var36 = (_Any_data *)_fbb;
    local_d4 = flatbuffers::FlatBufferBuilderImpl<false>::
               CreateVector<unsigned_char,_flatbuffers::Offset,_flatbuffers::Vector>
                         (_fbb,(uchar *)plVar35,sVar32);
  }
  pSVar11 = (_o->testempty)._M_t.
            super___uniq_ptr_impl<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>
            ._M_t.
            super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
            .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl;
  if (pSVar11 != (StatT *)0x0) {
    sVar32 = (pSVar11->id)._M_string_length;
    if (sVar32 == 0) {
      off.o = 0;
    }
    else {
      uStackY_2d0 = 0x1751cd;
      flatbuffers::FlatBufferBuilderImpl<false>::CreateStringImpl
                (_fbb,(pSVar11->id)._M_dataplus._M_p,sVar32);
      off.o = (_fbb->buf_).size_;
    }
    e_00 = pSVar11->val;
    e = pSVar11->count;
    uStackY_2d0 = 0x1751e7;
    flatbuffers::FlatBufferBuilderImpl<false>::NotNested(_fbb);
    _fbb->nested = true;
    uVar6 = (_fbb->buf_).size_;
    uStackY_2d0 = 0x175200;
    flatbuffers::FlatBufferBuilderImpl<false>::AddElement<long>(_fbb,6,e_00,0);
    uStackY_2d0 = 0x175210;
    flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>(_fbb,4,off);
    uStackY_2d0 = 0x175222;
    flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_short>(_fbb,8,e,0);
    plVar35 = (long *)(ulong)uVar6;
    uStackY_2d0 = 0x17522c;
    p_Var36 = (_Any_data *)_fbb;
    uVar22 = flatbuffers::FlatBufferBuilderImpl<false>::EndTable(_fbb,uVar6);
    uVar34 = (ulong)uVar22;
  }
  p_Var18 = local_110;
  bVar2 = _o->testbool;
  uVar26 = CONCAT71((int7)(e_00 >> 8),bVar2);
  uVar6 = _o->testhashs32_fnv1;
  local_d8 = _o->testhashu32_fnv1;
  local_40 = _o->testhashs64_fnv1;
  local_48 = _o->testhashu64_fnv1;
  local_dc = _o->testhashs32_fnv1a;
  local_124.o = 0;
  uVar25 = 0;
  if (local_110 == (_Any_data *)0x0) {
LAB_001752c3:
    local_58 = _o->testhashs64_fnv1a;
    local_60 = _o->testhashu64_fnv1a;
    local_50 = uVar25;
    if (((long)(_o->testarrayofbools).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
        (long)(_o->testarrayofbools).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
        (ulong)(_o->testarrayofbools).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0) {
      uStackY_2d0 = 0x17531c;
      p_Var36 = (_Any_data *)_fbb;
      local_124 = flatbuffers::FlatBufferBuilderImpl<false>::CreateVector
                            (_fbb,&_o->testarrayofbools);
    }
    local_e0 = _o->testf;
    local_e4 = _o->testf2;
    local_e8 = _o->testf3;
    _Var9._M_current =
         (_o->testarrayofstring2).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    _Var10._M_current =
         (_o->testarrayofstring2).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_114.o = 0;
    local_ec.o = 0;
    if (_Var9._M_current != _Var10._M_current) {
      uStackY_2d0 = 0x175389;
      p_Var36 = (_Any_data *)_fbb;
      local_ec = flatbuffers::FlatBufferBuilderImpl<false>::
                 CreateVectorOfStrings<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                           (_fbb,_Var10,_Var9);
    }
    v = (_o->testarrayofsortedstruct).
        super__Vector_base<MyGame::Example::Ability,_std::allocator<MyGame::Example::Ability>_>.
        _M_impl.super__Vector_impl_data._M_start;
    lVar33 = (long)(_o->testarrayofsortedstruct).
                   super__Vector_base<MyGame::Example::Ability,_std::allocator<MyGame::Example::Ability>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)v;
    if (lVar33 != 0) {
      uStackY_2d0 = 0x1753b1;
      p_Var36 = (_Any_data *)_fbb;
      local_114 = flatbuffers::FlatBufferBuilderImpl<false>::
                  CreateVectorOfStructs<MyGame::Example::Ability,_flatbuffers::Offset,_flatbuffers::Vector>
                            (_fbb,v,lVar33 >> 3);
    }
    puVar7 = (_o->flex).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_118.o = 0;
    local_f0.o = 0;
    sVar32 = (long)(_o->flex).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar7;
    if (sVar32 != 0) {
      uStackY_2d0 = 0x1753e5;
      p_Var36 = (_Any_data *)_fbb;
      local_f0 = flatbuffers::FlatBufferBuilderImpl<false>::
                 CreateVector<unsigned_char,_flatbuffers::Offset,_flatbuffers::Vector>
                           (_fbb,puVar7,sVar32);
    }
    pTVar8 = (_o->test5).
             super__Vector_base<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar33 = (long)(_o->test5).
                   super__Vector_base<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8;
    if (lVar33 != 0) {
      uStackY_2d0 = 0x17540d;
      p_Var36 = (_Any_data *)_fbb;
      local_118 = flatbuffers::FlatBufferBuilderImpl<false>::
                  CreateVectorOfStructs<MyGame::Example::Test,_flatbuffers::Offset,_flatbuffers::Vector>
                            (_fbb,pTVar8,lVar33 >> 2);
    }
    plVar35 = (_o->vector_of_longs).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_11c.o = 0;
    local_f4.o = 0;
    lVar33 = (long)(_o->vector_of_longs).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)plVar35;
    if (lVar33 != 0) {
      uStackY_2d0 = 0x175445;
      p_Var36 = (_Any_data *)_fbb;
      local_f4 = flatbuffers::FlatBufferBuilderImpl<false>::
                 CreateVector<long,_flatbuffers::Offset,_flatbuffers::Vector>
                           (_fbb,plVar35,lVar33 >> 3);
    }
    v_00 = (_o->vector_of_doubles).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
    lVar33 = (long)(_o->vector_of_doubles).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)v_00;
    if (lVar33 != 0) {
      uStackY_2d0 = 0x17546d;
      p_Var36 = (_Any_data *)_fbb;
      local_11c = flatbuffers::FlatBufferBuilderImpl<false>::
                  CreateVector<double,_flatbuffers::Offset,_flatbuffers::Vector>
                            (_fbb,v_00,lVar33 >> 3);
    }
    local_120.o = 0;
    local_f8.o = 0;
    if ((_o->parent_namespace_test)._M_t.
        super___uniq_ptr_impl<MyGame::InParentNamespaceT,_std::default_delete<MyGame::InParentNamespaceT>_>
        ._M_t.
        super__Tuple_impl<0UL,_MyGame::InParentNamespaceT_*,_std::default_delete<MyGame::InParentNamespaceT>_>
        .super__Head_base<0UL,_MyGame::InParentNamespaceT_*,_false>._M_head_impl !=
        (InParentNamespaceT *)0x0) {
      uStackY_2d0 = 0x175497;
      flatbuffers::FlatBufferBuilderImpl<false>::NotNested(_fbb);
      _fbb->nested = true;
      uStackY_2d0 = 0x1754a6;
      p_Var36 = (_Any_data *)_fbb;
      local_f8.o = flatbuffers::FlatBufferBuilderImpl<false>::EndTable(_fbb,(_fbb->buf_).size_);
    }
    plVar35 = (long *)((long)(_o->vector_of_referrables).
                             super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(_o->vector_of_referrables).
                            super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    if (plVar35 != (long *)0x0) {
      plVar35 = (long *)((long)plVar35 >> 3);
      uStackY_2d0 = 0x1754d3;
      p_Var36 = (_Any_data *)_fbb;
      local_120 = flatbuffers::FlatBufferBuilderImpl<false>::
                  CreateVector<flatbuffers::Offset<MyGame::Example::Referrable>,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_2_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                            (_fbb,plVar35,&local_b0);
    }
    local_70 = 0;
    if (p_Var18 == (_Any_data *)0x0) {
      local_88 = 0;
    }
    else {
      local_138 = _o->single_weak_reference;
      if (*(long *)(p_Var18 + 1) == 0) goto LAB_00175aec;
      uStackY_2d0 = 0x175515;
      p_Var36 = p_Var18;
      local_88 = (**(code **)((long)p_Var18 + 0x18))(p_Var18,&local_138);
    }
    lVar33 = (long)(_o->vector_of_weak_references).
                   super__Vector_base<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(_o->vector_of_weak_references).
                   super__Vector_base<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar33 != 0) {
      uStackY_2d0 = 0x175551;
      p_Var36 = (_Any_data *)_fbb;
      OVar23 = flatbuffers::FlatBufferBuilderImpl<false>::
               CreateVector<unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_3_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                         (_fbb,lVar33 >> 3,&local_b0);
      local_70 = CONCAT44(extraout_var,OVar23.o);
    }
    lVar33 = (long)(_o->vector_of_strong_referrables).
                   super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(_o->vector_of_strong_referrables).
                   super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar33 == 0) {
      local_128.o = 0;
      plVar35 = (long *)0x0;
    }
    else {
      plVar35 = (long *)(lVar33 >> 3);
      uStackY_2d0 = 0x17557f;
      p_Var36 = (_Any_data *)_fbb;
      local_128 = flatbuffers::FlatBufferBuilderImpl<false>::
                  CreateVector<flatbuffers::Offset<MyGame::Example::Referrable>,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_4_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                            (_fbb,plVar35,&local_b0);
    }
    local_78 = 0;
    if (p_Var18 == (_Any_data *)0x0) {
      local_90 = 0;
    }
    else {
      local_138 = _o->co_owning_reference;
      if (*(long *)(p_Var18 + 1) == 0) goto LAB_00175aec;
      uStackY_2d0 = 0x1755ce;
      p_Var36 = p_Var18;
      local_90 = (**(code **)((long)p_Var18 + 0x18))(p_Var18,&local_138);
    }
    plVar35 = (long *)((long)(_o->vector_of_co_owning_references).
                             super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(_o->vector_of_co_owning_references).
                            super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    if (plVar35 != (long *)0x0) {
      plVar35 = (long *)((long)plVar35 >> 3);
      uStackY_2d0 = 0x17560a;
      p_Var36 = (_Any_data *)_fbb;
      OVar23 = flatbuffers::FlatBufferBuilderImpl<false>::
               CreateVector<unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_5_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                         (_fbb,plVar35,&local_b0);
      local_78 = CONCAT44(extraout_var_00,OVar23.o);
    }
    local_80 = 0;
    if (p_Var18 == (_Any_data *)0x0) {
      local_98 = 0;
    }
    else {
      local_138 = _o->non_owning_reference;
      if (*(long *)(p_Var18 + 1) == 0) goto LAB_00175aec;
      uStackY_2d0 = 0x17564d;
      local_98 = (**(code **)((long)p_Var18 + 0x18))(p_Var18,&local_138);
    }
    lVar33 = (long)(_o->vector_of_non_owning_references).
                   super__Vector_base<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(_o->vector_of_non_owning_references).
                   super__Vector_base<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar33 != 0) {
      uStackY_2d0 = 0x175689;
      OVar23 = flatbuffers::FlatBufferBuilderImpl<false>::
               CreateVector<unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_6_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                         (_fbb,lVar33 >> 3,&local_b0);
      local_80 = CONCAT44(extraout_var_01,OVar23.o);
    }
    AVar3 = (_o->any_unique).type;
    local_100 = (uint)AVar3;
    local_fc.o = (offset_type)uVar34;
    if (local_100 == 3) {
      uStackY_2d0 = 0x175714;
      flatbuffers::FlatBufferBuilderImpl<false>::NotNested(_fbb);
      _fbb->nested = true;
      uVar22 = (_fbb->buf_).size_;
    }
    else {
      if (AVar3 != AnyUniqueAliases_TS) {
        uVar26 = 0;
        if (AVar3 == AnyUniqueAliases_M) {
          uStackY_2d0 = 0x1756d3;
          OVar19 = CreateMonster(_fbb,(MonsterT *)(_o->any_unique).value,(rehasher_function_t *)0x0)
          ;
          uVar26 = CONCAT44(extraout_var_02,OVar19.o);
        }
        goto LAB_00175723;
      }
      uVar4 = *(_o->any_unique).value;
      uStackY_2d0 = 0x1756e8;
      flatbuffers::FlatBufferBuilderImpl<false>::NotNested(_fbb);
      _fbb->nested = true;
      uVar22 = (_fbb->buf_).size_;
      uStackY_2d0 = 0x175704;
      flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_char>(_fbb,4,uVar4,'\x02');
    }
    uStackY_2d0 = 0x175723;
    uVar22 = flatbuffers::FlatBufferBuilderImpl<false>::EndTable(_fbb,uVar22);
    uVar26 = CONCAT44(extraout_var_03,uVar22);
LAB_00175723:
    local_104.o = (offset_type)uVar26;
    AVar5 = (_o->any_ambiguous).type;
    local_68 = CONCAT71((int7)((ulong)uVar26 >> 8),AVar5);
    vector_of_enums.o = 0;
    local_108.o = 0;
    if ((byte)(AVar5 - AnyAmbiguousAliases_M1) < 3) {
      uStackY_2d0 = 0x17575c;
      local_108.o = (offset_type)
                    CreateMonster(_fbb,(MonsterT *)(_o->any_ambiguous).value,
                                  (rehasher_function_t *)0x0);
    }
    local_110 = (_Any_data *)CONCAT44(local_110._4_4_,uVar6);
    v_01 = (_o->vector_of_enums).
           super__Vector_base<MyGame::Example::Color,_std::allocator<MyGame::Example::Color>_>.
           _M_impl.super__Vector_impl_data._M_start;
    sVar32 = (long)(_o->vector_of_enums).
                   super__Vector_base<MyGame::Example::Color,_std::allocator<MyGame::Example::Color>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)v_01;
    if (sVar32 != 0) {
      uStackY_2d0 = 0x175788;
      vector_of_enums =
           flatbuffers::FlatBufferBuilderImpl<false>::
           CreateVectorScalarCast<unsigned_char,MyGame::Example::Color>(_fbb,v_01,sVar32);
    }
    signed_enum = _o->signed_enum;
    puVar7 = (_o->testrequirednestedflatbuffer).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    scalar_key_sorted_tables.o = 0;
    testrequirednestedflatbuffer.o = 0;
    sVar32 = (long)(_o->testrequirednestedflatbuffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar7;
    if (sVar32 != 0) {
      uStackY_2d0 = 0x1757b9;
      testrequirednestedflatbuffer =
           flatbuffers::FlatBufferBuilderImpl<false>::
           CreateVector<unsigned_char,_flatbuffers::Offset,_flatbuffers::Vector>(_fbb,puVar7,sVar32)
      ;
    }
    lVar33 = (long)(_o->scalar_key_sorted_tables).
                   super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(_o->scalar_key_sorted_tables).
                   super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar33 != 0) {
      uStackY_2d0 = 0x1757e2;
      scalar_key_sorted_tables =
           flatbuffers::FlatBufferBuilderImpl<false>::
           CreateVector<flatbuffers::Offset<MyGame::Example::Stat>,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_7_,MyGame::Example::CreateMonster(flatbuffers::FlatBufferBuilderImpl<false>&,MyGame::Example::MonsterT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                     (_fbb,lVar33 >> 3,&local_b0);
    }
    uStackY_2d0 = 0x175ada;
    OVar19 = CreateMonster(_fbb,local_38,local_12a,local_12c,local_b4,local_b8,color,(Any)local_bc,
                           local_c0,local_c8,local_c4,local_d0,local_cc,local_d4,local_fc,bVar2,
                           (int32_t)local_110,local_d8,local_40,local_48,local_dc,(uint32_t)local_50
                           ,local_58,local_60,local_124,local_e0,local_e4,local_e8,local_ec,
                           local_114,local_f0,local_118,local_f4,local_11c,local_f8,local_120,
                           local_88,(offset_type)local_70,local_128,local_90,(offset_type)local_78,
                           local_98,(offset_type)local_80,(AnyUniqueAliases)local_100,local_104,
                           (AnyAmbiguousAliases)local_68,local_108,vector_of_enums,signed_enum,
                           testrequirednestedflatbuffer,scalar_key_sorted_tables,&_o->native_inline,
                           _o->long_enum_non_enum_default,_o->long_enum_normal_default,
                           _o->nan_default,_o->inf_default,_o->positive_inf_default,
                           _o->infinity_default,_o->positive_infinity_default,
                           _o->negative_inf_default,_o->negative_infinity_default,
                           _o->double_inf_default);
    return (Offset<MyGame::Example::Monster>)OVar19.o;
  }
  local_138 = (ReferrableT *)_o->testhashu32_fnv1a;
  if (*(long *)(local_110 + 1) != 0) {
    uStackY_2d0 = 0x1752c3;
    p_Var36 = local_110;
    uVar25 = (**(code **)((long)local_110 + 0x18))(local_110,&local_138);
    goto LAB_001752c3;
  }
LAB_00175aec:
  uStackY_2d0 = 0x175af1;
  std::__throw_bad_function_call();
  p_StackY_2e0 = p_Var18;
  puVar12 = (undefined4 *)*plVar35;
  pFStackY_2f8 = _fbb;
  pMStackY_2f0 = _o;
  uStackY_2e8 = (ulong)uVar6;
  uStackY_2d8 = uVar26;
  uStackY_2d0 = uVar34;
  if (puVar12 == (undefined4 *)0x0) {
    puVar27 = (undefined4 *)0x0;
  }
  else {
    puVar27 = (undefined4 *)operator_new(0x20);
    uVar14 = puVar12[1];
    uVar15 = puVar12[2];
    uVar16 = puVar12[3];
    uVar26 = *(undefined8 *)(puVar12 + 4);
    uVar17 = *(undefined8 *)(puVar12 + 6);
    *puVar27 = *puVar12;
    puVar27[1] = uVar14;
    puVar27[2] = uVar15;
    puVar27[3] = uVar16;
    *(undefined8 *)(puVar27 + 4) = uVar26;
    *(undefined8 *)(puVar27 + 6) = uVar17;
  }
  *(undefined4 **)p_Var36 = puVar27;
  *(short *)((long)p_Var36 + 8) = (short)plVar35[1];
  *(undefined2 *)((long)p_Var36 + 10) = *(undefined2 *)((long)plVar35 + 10);
  *(_Any_data **)(p_Var36 + 1) = p_Var36 + 2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(p_Var36 + 1),plVar35[2],plVar35[3] + plVar35[2]);
  p_StackY_360 = p_Var36 + 3;
  p_StackY_358 = p_Var36 + 1;
  p_StackY_350 = p_Var36 + 2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)p_StackY_360,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(plVar35 + 6));
  *(uchar *)((long)p_Var36 + 0x48) = (uchar)plVar35[9];
  uVar4 = (uchar)plVar35[10];
  p_Var36->_M_pod_data[0x50] = uVar4;
  *(size_t *)(p_Var36->_M_pod_data + 0x58) = 0;
  if (uVar4 == '\x03') {
    pMVar28 = (MonsterT *)operator_new(1);
LAB_00175bee:
    *(MonsterT **)(p_Var36->_M_pod_data + 0x58) = pMVar28;
  }
  else {
    if (uVar4 == '\x02') {
      pMVar28 = (MonsterT *)operator_new(1);
      *(undefined1 *)
       &(pMVar28->pos)._M_t.
        super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>.
        _M_t.
        super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>
        .super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl =
           *(undefined1 *)plVar35[0xb];
      goto LAB_00175bee;
    }
    if (uVar4 == '\x01') {
      pMVar28 = (MonsterT *)operator_new(800);
      MonsterT::MonsterT(pMVar28,(MonsterT *)plVar35[0xb]);
      goto LAB_00175bee;
    }
  }
  pbStackY_368 = (bool *)(p_Var36->_M_pod_data + 0x60);
  std::vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>::vector
            ((vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_> *)pbStackY_368,
             (vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_> *)
             (plVar35 + 0xc));
  ppSStackY_370 = (StringOffsetMap **)(p_Var36->_M_pod_data + 0x78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)ppSStackY_370,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(plVar35 + 0xf));
  p_StackY_380 = p_Var36 + 9;
  *(size_t *)(p_Var36 + 9) = 0;
  *(undefined8 *)((long)p_Var36 + 0x98) = 0;
  *(size_t *)(p_Var36 + 10) = 0;
  pMVar28 = (MonsterT *)plVar35[0x15];
  if (pMVar28 == (MonsterT *)0x0) {
    this = (MonsterT *)0x0;
  }
  else {
    this = (MonsterT *)operator_new(800);
    MonsterT::MonsterT(this,pMVar28);
  }
  *(MonsterT **)((long)p_Var36 + 0xa8) = this;
  p_StackY_378 = p_Var36 + 0xb;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)p_StackY_378,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(plVar35 + 0x16));
  plVar37 = (long *)plVar35[0x19];
  if (plVar37 == (long *)0x0) {
    psVar29 = (string *)0x0;
  }
  else {
    psVar29 = (string *)operator_new(0x30);
    *(string **)psVar29 = psVar29 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar29,*plVar37,plVar37[1] + *plVar37);
    *(short *)(psVar29 + 0x28) = (short)plVar37[5];
    *(long *)(psVar29 + 0x20) = plVar37[4];
  }
  *(string **)((long)p_Var36 + 200) = psVar29;
  p_Var36->_M_pod_data[0xd0] = (uchar)plVar35[0x1a];
  *(undefined4 *)(p_Var36->_M_pod_data + 0xd4) = *(undefined4 *)((long)plVar35 + 0xd4);
  *(int *)(p_Var36->_M_pod_data + 0xd8) = (int)plVar35[0x1b];
  *(long *)(p_Var36->_M_pod_data + 0xe0) = plVar35[0x1c];
  *(long *)(p_Var36->_M_pod_data + 0xe8) = plVar35[0x1d];
  *(int *)(p_Var36->_M_pod_data + 0xf0) = (int)plVar35[0x1e];
  *(StringOffsetMap **)(p_Var36->_M_pod_data + 0xf8) = (StringOffsetMap *)plVar35[0x1f];
  *(long *)(p_Var36 + 0x10) = plVar35[0x20];
  *(long *)((long)p_Var36 + 0x108) = plVar35[0x21];
  p_StackY_300 = p_Var36 + 0x11;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)p_StackY_300,
             (vector<bool,_std::allocator<bool>_> *)(plVar35 + 0x22));
  *(int *)((long)p_Var36 + 0x138) = (int)plVar35[0x27];
  *(undefined4 *)((long)p_Var36 + 0x13c) = *(undefined4 *)((long)plVar35 + 0x13c);
  *(int *)(p_Var36 + 0x14) = (int)plVar35[0x28];
  ppuStackY_308 = (uint8_t **)((long)p_Var36 + 0x148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)ppuStackY_308,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(plVar35 + 0x29));
  pbStackY_310 = (bool *)(p_Var36->_M_pod_data + 0x160);
  std::vector<MyGame::Example::Ability,_std::allocator<MyGame::Example::Ability>_>::vector
            ((vector<MyGame::Example::Ability,_std::allocator<MyGame::Example::Ability>_> *)
             pbStackY_310,
             (vector<MyGame::Example::Ability,_std::allocator<MyGame::Example::Ability>_> *)
             (plVar35 + 0x2c));
  ppSStackY_318 = (StringOffsetMap **)(p_Var36->_M_pod_data + 0x178);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppSStackY_318,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(plVar35 + 0x2f));
  p_StackY_320 = p_Var36 + 0x19;
  std::vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>::vector
            ((vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_> *)p_StackY_320,
             (vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_> *)
             (plVar35 + 0x32));
  psStackY_328 = (size_t *)((long)p_Var36 + 0x1a8);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)psStackY_328,
             (vector<long,_std::allocator<long>_> *)(plVar35 + 0x35));
  p_StackY_330 = p_Var36 + 0x1c;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)p_StackY_330,
             (vector<double,_std::allocator<double>_> *)(plVar35 + 0x38));
  if (plVar35[0x3b] == 0) {
    pvVar30 = (void *)0x0;
  }
  else {
    pvVar30 = operator_new(1);
  }
  *(void **)(p_Var36->_M_pod_data + 0x1d8) = pvVar30;
  pvStackY_388 = (vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
                  *)(p_Var36->_M_pod_data + 0x1e0);
  *(undefined8 *)(p_Var36->_M_pod_data + 0x1e0) = 0;
  *(size_t *)(p_Var36->_M_pod_data + 0x1e8) = 0;
  *(undefined8 *)(p_Var36->_M_pod_data + 0x1f0) = 0;
  *(StringOffsetMap **)(p_Var36->_M_pod_data + 0x1f8) = (StringOffsetMap *)plVar35[0x3f];
  p_StackY_338 = p_Var36 + 0x20;
  std::vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>::
  vector((vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_> *)
         p_StackY_338,
         (vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_> *)
         (plVar35 + 0x40));
  pvStackY_390 = (vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
                  *)((long)p_Var36 + 0x218);
  *(undefined8 *)((long)p_Var36 + 0x218) = 0;
  *(size_t *)(p_Var36 + 0x22) = 0;
  *(size_t *)((long)p_Var36 + 0x228) = 0;
  *(long *)(p_Var36 + 0x23) = plVar35[0x46];
  pvStackY_398 = (vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
                  *)((long)p_Var36 + 0x238);
  *(uint8_t **)((long)p_Var36 + 0x238) = (uint8_t *)0x0;
  *(uint8_t **)(p_Var36 + 0x24) = (uint8_t *)0x0;
  *(uint8_t **)((long)p_Var36 + 0x248) = (uint8_t *)0x0;
  *(long *)(p_Var36->_M_pod_data + 0x250) = plVar35[0x4a];
  psStackY_340 = (size_t *)(p_Var36->_M_pod_data + 600);
  std::vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>::
  vector((vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_> *)
         psStackY_340,
         (vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_> *)
         (plVar35 + 0x4b));
  bVar2 = SUB81(plVar35[0x4e],0);
  p_Var36->_M_pod_data[0x270] = bVar2;
  *(StringOffsetMap **)(p_Var36->_M_pod_data + 0x278) = (StringOffsetMap *)0x0;
  if (bVar2 == true) {
    pMVar28 = (MonsterT *)operator_new(1);
  }
  else if (bVar2 == true) {
    pMVar28 = (MonsterT *)operator_new(1);
    *(undefined1 *)
     &(pMVar28->pos)._M_t.
      super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>._M_t
      .super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>.
      super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl =
         *(undefined1 *)plVar35[0x4f];
  }
  else {
    if (bVar2 != true) goto LAB_00175f8a;
    pMVar28 = (MonsterT *)operator_new(800);
    MonsterT::MonsterT(pMVar28,(MonsterT *)plVar35[0x4f]);
  }
  *(MonsterT **)(p_Var36->_M_pod_data + 0x278) = pMVar28;
LAB_00175f8a:
  p_StackY_348 = p_Var36 + 0x28;
  AnyAmbiguousAliasesUnion::AnyAmbiguousAliasesUnion
            ((AnyAmbiguousAliasesUnion *)p_StackY_348,(AnyAmbiguousAliasesUnion *)(plVar35 + 0x50));
  p_StackY_3b0 = p_Var36 + 0x29;
  std::vector<MyGame::Example::Color,_std::allocator<MyGame::Example::Color>_>::vector
            ((vector<MyGame::Example::Color,_std::allocator<MyGame::Example::Color>_> *)p_StackY_3b0
             ,(vector<MyGame::Example::Color,_std::allocator<MyGame::Example::Color>_> *)
              (plVar35 + 0x52));
  *(uchar *)((long)p_Var36 + 0x2a8) = (uchar)plVar35[0x55];
  p_StackY_3a8 = p_Var36 + 0x2b;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)p_StackY_3a8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(plVar35 + 0x56));
  pvStackY_3a0 = (vector<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>,std::allocator<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>>>
                  *)((long)p_Var36 + 0x2c8);
  *(uint8_t **)((long)p_Var36 + 0x2c8) = (uint8_t *)0x0;
  *(undefined8 *)(p_Var36->_M_pod_data + 0x2d0) = 0;
  *(size_t *)(p_Var36->_M_pod_data + 0x2d8) = 0;
  *(int *)(p_Var36->_M_pod_data + 0x2e0) = (int)plVar35[0x5c];
  *(long *)(p_Var36->_M_pod_data + 0x2e8) = plVar35[0x5d];
  *(long *)(p_Var36->_M_pod_data + 0x2f0) = plVar35[0x5e];
  *(int *)(p_Var36->_M_pod_data + 0x2f8) = (int)plVar35[0x5f];
  *(undefined4 *)(p_Var36->_M_pod_data + 0x2fc) = *(undefined4 *)((long)plVar35 + 0x2fc);
  *(int *)(p_Var36 + 0x30) = (int)plVar35[0x60];
  *(undefined4 *)((long)p_Var36 + 0x304) = *(undefined4 *)((long)plVar35 + 0x304);
  *(int *)((long)p_Var36 + 0x308) = (int)plVar35[0x61];
  *(undefined4 *)((long)p_Var36 + 0x30c) = *(undefined4 *)((long)plVar35 + 0x30c);
  *(int *)(p_Var36 + 0x31) = (int)plVar35[0x62];
  *(long *)((long)p_Var36 + 0x318) = plVar35[99];
  std::
  vector<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
  ::reserve((vector<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
             *)p_StackY_380,plVar35[0x13] - plVar35[0x12] >> 3);
  plVar37 = (long *)plVar35[0x12];
  plVar13 = (long *)plVar35[0x13];
  if (plVar37 != plVar13) {
    do {
      if (*plVar37 == 0) {
        pMVar28 = (MonsterT *)0x0;
      }
      else {
        pMVar28 = (MonsterT *)operator_new(800);
        MonsterT::MonsterT(pMVar28,(MonsterT *)*plVar37);
      }
      pMStackY_3b8 = pMVar28;
      std::
      vector<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>,std::allocator<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>>>
      ::emplace_back<MyGame::Example::MonsterT*>
                ((vector<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>,std::allocator<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>>>
                  *)p_StackY_380->_M_pod_data,&pMStackY_3b8);
      plVar37 = plVar37 + 1;
    } while (plVar37 != plVar13);
  }
  std::
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ::reserve((vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
             *)pvStackY_388,plVar35[0x3d] - plVar35[0x3c] >> 3);
  plVar37 = (long *)plVar35[0x3c];
  plVar13 = (long *)plVar35[0x3d];
  if (plVar37 != plVar13) {
    do {
      if (*plVar37 == 0) {
        pMStackY_3b8 = (MonsterT *)0x0;
      }
      else {
        pMStackY_3b8 = (MonsterT *)operator_new(8);
        (pMStackY_3b8->pos)._M_t.
        super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>.
        _M_t.
        super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>
        .super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl = *(Vec3 **)*plVar37;
      }
      std::
      vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
      ::emplace_back<MyGame::Example::ReferrableT*>(pvStackY_388,(ReferrableT **)&pMStackY_3b8);
      plVar37 = plVar37 + 1;
    } while (plVar37 != plVar13);
  }
  std::
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ::reserve((vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
             *)pvStackY_390,plVar35[0x44] - plVar35[0x43] >> 3);
  plVar37 = (long *)plVar35[0x43];
  plVar13 = (long *)plVar35[0x44];
  if (plVar37 != plVar13) {
    do {
      if (*plVar37 == 0) {
        pMStackY_3b8 = (MonsterT *)0x0;
      }
      else {
        pMStackY_3b8 = (MonsterT *)operator_new(8);
        (pMStackY_3b8->pos)._M_t.
        super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>.
        _M_t.
        super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>
        .super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl = *(Vec3 **)*plVar37;
      }
      std::
      vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
      ::emplace_back<MyGame::Example::ReferrableT*>(pvStackY_390,(ReferrableT **)&pMStackY_3b8);
      plVar37 = plVar37 + 1;
    } while (plVar37 != plVar13);
  }
  std::
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ::reserve((vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
             *)pvStackY_398,plVar35[0x48] - plVar35[0x47] >> 3);
  plVar37 = (long *)plVar35[0x47];
  plVar13 = (long *)plVar35[0x48];
  if (plVar37 != plVar13) {
    do {
      if (*plVar37 == 0) {
        pMStackY_3b8 = (MonsterT *)0x0;
      }
      else {
        pMStackY_3b8 = (MonsterT *)operator_new(8);
        (pMStackY_3b8->pos)._M_t.
        super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>.
        _M_t.
        super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>
        .super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl = *(Vec3 **)*plVar37;
      }
      std::
      vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
      ::emplace_back<MyGame::Example::ReferrableT*>(pvStackY_398,(ReferrableT **)&pMStackY_3b8);
      plVar37 = plVar37 + 1;
    } while (plVar37 != plVar13);
  }
  std::
  vector<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
  ::reserve((vector<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
             *)pvStackY_3a0,plVar35[0x5a] - plVar35[0x59] >> 3);
  plVar37 = (long *)plVar35[0x59];
  plVar35 = (long *)plVar35[0x5a];
  oVar24 = extraout_EAX;
  if (plVar37 != plVar35) {
    do {
      if (*plVar37 == 0) {
        pMVar28 = (MonsterT *)0x0;
      }
      else {
        pMVar28 = (MonsterT *)operator_new(0x30);
        plVar13 = (long *)*plVar37;
        (pMVar28->pos)._M_t.
        super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>.
        _M_t.
        super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>
        .super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl = (Vec3 *)&pMVar28->name
        ;
        std::__cxx11::string::_M_construct<char*>((string *)pMVar28,*plVar13,plVar13[1] + *plVar13);
        *(short *)((long)&(pMVar28->name).field_2 + 8) = (short)plVar13[5];
        (pMVar28->name).field_2._M_allocated_capacity = plVar13[4];
      }
      pMStackY_3b8 = pMVar28;
      pvVar31 = std::
                vector<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>,std::allocator<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>>>
                ::emplace_back<MyGame::Example::StatT*>(pvStackY_3a0,(StatT **)&pMStackY_3b8);
      oVar24 = (offset_type)pvVar31;
      plVar37 = plVar37 + 1;
    } while (plVar37 != plVar35);
  }
  return (Offset<MyGame::Example::Monster>)oVar24;
}

Assistant:

inline ::flatbuffers::Offset<Monster> CreateMonster(::flatbuffers::FlatBufferBuilder &_fbb, const MonsterT *_o, const ::flatbuffers::rehasher_function_t *_rehasher) {
  (void)_rehasher;
  (void)_o;
  struct _VectorArgs { ::flatbuffers::FlatBufferBuilder *__fbb; const MonsterT* __o; const ::flatbuffers::rehasher_function_t *__rehasher; } _va = { &_fbb, _o, _rehasher}; (void)_va;
  auto _pos = _o->pos ? _o->pos.get() : nullptr;
  auto _mana = _o->mana;
  auto _hp = _o->hp;
  auto _name = _fbb.CreateString(_o->name);
  auto _inventory = _o->inventory.size() ? _fbb.CreateVector(_o->inventory) : 0;
  auto _color = _o->color;
  auto _test_type = _o->test.type;
  auto _test = _o->test.Pack(_fbb);
  auto _test4 = _o->test4.size() ? _fbb.CreateVectorOfStructs(_o->test4) : 0;
  auto _testarrayofstring = _o->testarrayofstring.size() ? _fbb.CreateVectorOfStrings(_o->testarrayofstring) : 0;
  auto _testarrayoftables = _o->testarrayoftables.size() ? _fbb.CreateVector<::flatbuffers::Offset<MyGame::Example::Monster>> (_o->testarrayoftables.size(), [](size_t i, _VectorArgs *__va) { return CreateMonster(*__va->__fbb, __va->__o->testarrayoftables[i].get(), __va->__rehasher); }, &_va ) : 0;
  auto _enemy = _o->enemy ? CreateMonster(_fbb, _o->enemy.get(), _rehasher) : 0;
  auto _testnestedflatbuffer = _o->testnestedflatbuffer.size() ? _fbb.CreateVector(_o->testnestedflatbuffer) : 0;
  auto _testempty = _o->testempty ? CreateStat(_fbb, _o->testempty.get(), _rehasher) : 0;
  auto _testbool = _o->testbool;
  auto _testhashs32_fnv1 = _o->testhashs32_fnv1;
  auto _testhashu32_fnv1 = _o->testhashu32_fnv1;
  auto _testhashs64_fnv1 = _o->testhashs64_fnv1;
  auto _testhashu64_fnv1 = _o->testhashu64_fnv1;
  auto _testhashs32_fnv1a = _o->testhashs32_fnv1a;
  auto _testhashu32_fnv1a = _rehasher ? static_cast<uint32_t>((*_rehasher)(_o->testhashu32_fnv1a)) : 0;
  auto _testhashs64_fnv1a = _o->testhashs64_fnv1a;
  auto _testhashu64_fnv1a = _o->testhashu64_fnv1a;
  auto _testarrayofbools = _o->testarrayofbools.size() ? _fbb.CreateVector(_o->testarrayofbools) : 0;
  auto _testf = _o->testf;
  auto _testf2 = _o->testf2;
  auto _testf3 = _o->testf3;
  auto _testarrayofstring2 = _o->testarrayofstring2.size() ? _fbb.CreateVectorOfStrings(_o->testarrayofstring2) : 0;
  auto _testarrayofsortedstruct = _o->testarrayofsortedstruct.size() ? _fbb.CreateVectorOfStructs(_o->testarrayofsortedstruct) : 0;
  auto _flex = _o->flex.size() ? _fbb.CreateVector(_o->flex) : 0;
  auto _test5 = _o->test5.size() ? _fbb.CreateVectorOfStructs(_o->test5) : 0;
  auto _vector_of_longs = _o->vector_of_longs.size() ? _fbb.CreateVector(_o->vector_of_longs) : 0;
  auto _vector_of_doubles = _o->vector_of_doubles.size() ? _fbb.CreateVector(_o->vector_of_doubles) : 0;
  auto _parent_namespace_test = _o->parent_namespace_test ? CreateInParentNamespace(_fbb, _o->parent_namespace_test.get(), _rehasher) : 0;
  auto _vector_of_referrables = _o->vector_of_referrables.size() ? _fbb.CreateVector<::flatbuffers::Offset<MyGame::Example::Referrable>> (_o->vector_of_referrables.size(), [](size_t i, _VectorArgs *__va) { return CreateReferrable(*__va->__fbb, __va->__o->vector_of_referrables[i].get(), __va->__rehasher); }, &_va ) : 0;
  auto _single_weak_reference = _rehasher ? static_cast<uint64_t>((*_rehasher)(_o->single_weak_reference)) : 0;
  auto _vector_of_weak_references = _o->vector_of_weak_references.size() ? _fbb.CreateVector<uint64_t>(_o->vector_of_weak_references.size(), [](size_t i, _VectorArgs *__va) { return __va->__rehasher ? static_cast<uint64_t>((*__va->__rehasher)(__va->__o->vector_of_weak_references[i])) : 0; }, &_va ) : 0;
  auto _vector_of_strong_referrables = _o->vector_of_strong_referrables.size() ? _fbb.CreateVector<::flatbuffers::Offset<MyGame::Example::Referrable>> (_o->vector_of_strong_referrables.size(), [](size_t i, _VectorArgs *__va) { return CreateReferrable(*__va->__fbb, __va->__o->vector_of_strong_referrables[i].get(), __va->__rehasher); }, &_va ) : 0;
  auto _co_owning_reference = _rehasher ? static_cast<uint64_t>((*_rehasher)(_o->co_owning_reference)) : 0;
  auto _vector_of_co_owning_references = _o->vector_of_co_owning_references.size() ? _fbb.CreateVector<uint64_t>(_o->vector_of_co_owning_references.size(), [](size_t i, _VectorArgs *__va) { return __va->__rehasher ? static_cast<uint64_t>((*__va->__rehasher)(__va->__o->vector_of_co_owning_references[i].get())) : 0; }, &_va ) : 0;
  auto _non_owning_reference = _rehasher ? static_cast<uint64_t>((*_rehasher)(_o->non_owning_reference)) : 0;
  auto _vector_of_non_owning_references = _o->vector_of_non_owning_references.size() ? _fbb.CreateVector<uint64_t>(_o->vector_of_non_owning_references.size(), [](size_t i, _VectorArgs *__va) { return __va->__rehasher ? static_cast<uint64_t>((*__va->__rehasher)(__va->__o->vector_of_non_owning_references[i])) : 0; }, &_va ) : 0;
  auto _any_unique_type = _o->any_unique.type;
  auto _any_unique = _o->any_unique.Pack(_fbb);
  auto _any_ambiguous_type = _o->any_ambiguous.type;
  auto _any_ambiguous = _o->any_ambiguous.Pack(_fbb);
  auto _vector_of_enums = _o->vector_of_enums.size() ? _fbb.CreateVectorScalarCast<uint8_t>(::flatbuffers::data(_o->vector_of_enums), _o->vector_of_enums.size()) : 0;
  auto _signed_enum = _o->signed_enum;
  auto _testrequirednestedflatbuffer = _o->testrequirednestedflatbuffer.size() ? _fbb.CreateVector(_o->testrequirednestedflatbuffer) : 0;
  auto _scalar_key_sorted_tables = _o->scalar_key_sorted_tables.size() ? _fbb.CreateVector<::flatbuffers::Offset<MyGame::Example::Stat>> (_o->scalar_key_sorted_tables.size(), [](size_t i, _VectorArgs *__va) { return CreateStat(*__va->__fbb, __va->__o->scalar_key_sorted_tables[i].get(), __va->__rehasher); }, &_va ) : 0;
  auto _native_inline = &_o->native_inline;
  auto _long_enum_non_enum_default = _o->long_enum_non_enum_default;
  auto _long_enum_normal_default = _o->long_enum_normal_default;
  auto _nan_default = _o->nan_default;
  auto _inf_default = _o->inf_default;
  auto _positive_inf_default = _o->positive_inf_default;
  auto _infinity_default = _o->infinity_default;
  auto _positive_infinity_default = _o->positive_infinity_default;
  auto _negative_inf_default = _o->negative_inf_default;
  auto _negative_infinity_default = _o->negative_infinity_default;
  auto _double_inf_default = _o->double_inf_default;
  return MyGame::Example::CreateMonster(
      _fbb,
      _pos,
      _mana,
      _hp,
      _name,
      _inventory,
      _color,
      _test_type,
      _test,
      _test4,
      _testarrayofstring,
      _testarrayoftables,
      _enemy,
      _testnestedflatbuffer,
      _testempty,
      _testbool,
      _testhashs32_fnv1,
      _testhashu32_fnv1,
      _testhashs64_fnv1,
      _testhashu64_fnv1,
      _testhashs32_fnv1a,
      _testhashu32_fnv1a,
      _testhashs64_fnv1a,
      _testhashu64_fnv1a,
      _testarrayofbools,
      _testf,
      _testf2,
      _testf3,
      _testarrayofstring2,
      _testarrayofsortedstruct,
      _flex,
      _test5,
      _vector_of_longs,
      _vector_of_doubles,
      _parent_namespace_test,
      _vector_of_referrables,
      _single_weak_reference,
      _vector_of_weak_references,
      _vector_of_strong_referrables,
      _co_owning_reference,
      _vector_of_co_owning_references,
      _non_owning_reference,
      _vector_of_non_owning_references,
      _any_unique_type,
      _any_unique,
      _any_ambiguous_type,
      _any_ambiguous,
      _vector_of_enums,
      _signed_enum,
      _testrequirednestedflatbuffer,
      _scalar_key_sorted_tables,
      _native_inline,
      _long_enum_non_enum_default,
      _long_enum_normal_default,
      _nan_default,
      _inf_default,
      _positive_inf_default,
      _infinity_default,
      _positive_infinity_default,
      _negative_inf_default,
      _negative_infinity_default,
      _double_inf_default);
}